

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

bstrList * bsplit(bstring str,uchar splitChar)

{
  int iVar1;
  bstring local_38;
  genBstrList g;
  uchar splitChar_local;
  bstring str_local;
  
  if (((str == (bstring)0x0) || (str->data == (uchar *)0x0)) || (str->slen < 0)) {
    str_local = (bstring)0x0;
  }
  else {
    g.bl._0_4_ = 4;
    g._23_1_ = splitChar;
    g.b = (bstring)malloc(0x28);
    if (g.b == (bstring)0x0) {
      str_local = (bstring)0x0;
    }
    else {
      (g.b)->mlen = 0;
      local_38 = str;
      iVar1 = bsplitcb(str,g._23_1_,0,bscb,&local_38);
      if (iVar1 < 0) {
        bstrListDestroy((bstrList *)g.b);
        str_local = (bstring)0x0;
      }
      else {
        str_local = g.b;
      }
    }
  }
  return (bstrList *)str_local;
}

Assistant:

struct bstrList * bsplit (const bstring str, unsigned char splitChar) {
struct genBstrList g;

	if (str == NULL || str->data == NULL || str->slen < 0) return NULL;

	g.mlen = 4;
	g.bl = (struct bstrList *) bstr__alloc (BLE_SZ + sizeof (bstring) * g.mlen);
	if (g.bl == NULL) return NULL;
	g.b = str;
	g.bl->qty = 0;
	if (bsplitcb (str, splitChar, 0, bscb, &g) < 0) {
		bstrListDestroy (g.bl);
		return NULL;
	}
	return g.bl;
}